

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

int __thiscall CAPSFile::CreateData(CAPSFile *this,IDisk *disk,int side,uint tr,int datakey)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  int iVar19;
  undefined8 uVar20;
  uchar byte_00;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uchar *buffer;
  uchar *puVar24;
  size_type sVar25;
  pointer paVar26;
  long lVar27;
  reference paVar28;
  bool bVar29;
  char cVar30;
  char cVar31;
  char extraout_XMM0_Be;
  char cVar32;
  char extraout_XMM0_Be_00;
  char extraout_XMM0_Bf;
  char cVar33;
  char extraout_XMM0_Bf_00;
  char extraout_XMM0_Bg;
  char cVar34;
  char extraout_XMM0_Bg_00;
  char extraout_XMM0_Bh;
  char cVar35;
  char extraout_XMM0_Bh_00;
  char extraout_XMM0_Bi;
  char cVar36;
  char extraout_XMM0_Bi_00;
  char extraout_XMM0_Bj;
  char cVar37;
  char extraout_XMM0_Bj_00;
  char extraout_XMM0_Bk;
  char cVar38;
  char extraout_XMM0_Bk_00;
  char extraout_XMM0_Bl;
  char cVar39;
  char extraout_XMM0_Bl_00;
  char extraout_XMM0_Bm;
  char cVar40;
  char extraout_XMM0_Bm_00;
  char extraout_XMM0_Bn;
  char cVar41;
  char extraout_XMM0_Bn_00;
  char extraout_XMM0_Bo;
  char cVar42;
  char extraout_XMM0_Bo_00;
  byte extraout_XMM0_Bp;
  byte bVar43;
  byte extraout_XMM0_Bp_00;
  uint local_1a8;
  uint local_1a0;
  int dbg_2;
  __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
  local_180;
  __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
  local_178;
  iterator it;
  int final_offset;
  int final_data_offset;
  int final_gap_offset;
  bool byte_size;
  uint uStack_15c;
  uchar byte;
  int dbg_1;
  uint offset_gap_1;
  int nb_gap_bytes;
  uint offset_gap_2;
  int end_of_block;
  uint search_next_offset;
  BlockDescriptor block_descriptor;
  uint local_120;
  int nb_backward_gap_bytes;
  uint offset_gap;
  int initial_backward_gap;
  int dbg;
  uchar uStack_108;
  uchar uStack_107;
  uchar uStack_106;
  uchar uStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  uchar uStack_101;
  uchar pattern_byte [16];
  uint local_f0;
  uint current_recored_offset;
  uint search_offset;
  uint startbitpos;
  uchar *track_field;
  vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
  list_block_descriptor;
  int max_size_data;
  int gap_offset;
  StreamRecording data;
  StreamRecording gap_data;
  bool abort;
  DataChunks data_chunk;
  ImgeItem imge_item;
  int datakey_local;
  uint tr_local;
  int side_local;
  IDisk *disk_local;
  CAPSFile *this_local;
  
  gap_data.size._3_1_ = 0;
  data.buffer._4_4_ = 0;
  _max_size_data = (uchar *)operator_new__(0x80);
  data.buffer._0_4_ = 0x80;
  gap_data.buffer._4_4_ = 0;
  data._8_8_ = operator_new__(0x80);
  gap_data.buffer._0_4_ = 0x80;
  list_block_descriptor.
  super__Vector_base<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80;
  std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::vector
            ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_> *)
             &track_field);
  memset(&data_chunk.buffer,0,0x50);
  memset(&gap_data.offset,0,0x24);
  data_chunk.buffer._0_4_ = 0x45474d49;
  data_chunk.buffer._4_4_ = 0x50;
  if (((int)(uint)disk->nb_sides_ <= side) || (disk->side_[side].nb_tracks <= tr)) {
    gap_data.size._3_1_ = 1;
  }
  _search_offset = (uchar *)0x0;
  if (((gap_data.size._3_1_ & 1) == 0) &&
     (_search_offset = disk->side_[side].tracks[tr].bitfield, _search_offset == (uchar *)0x0)) {
    gap_data.size._3_1_ = 1;
  }
  imge_item.track_byte = 0;
  pattern_byte[0xc] = '\0';
  pattern_byte[0xd] = '\0';
  pattern_byte[0xe] = '\0';
  pattern_byte[0xf] = '\0';
  if ((gap_data.size._3_1_ & 1) == 0) {
    local_1a0 = FindNextPattern(_search_offset,disk->side_[side].tracks[tr].size,0,"R$R$R$",6);
    if (local_1a0 == 0xffffffff) {
      local_1a8 = FindNextSector(_search_offset,disk->side_[side].tracks[tr].size,0,8);
      if (local_1a8 == 0xffffffff) {
        imge_item.track_byte = 0;
        gap_data.size._3_1_ = 1;
      }
      else {
        if (local_1a8 == 0xffffffff) {
          local_1a8 = 0;
        }
        imge_item.track_byte = local_1a8;
      }
    }
    else {
      if (local_1a0 == 0xffffffff) {
        local_1a0 = 0;
      }
      imge_item.track_byte = local_1a0;
    }
  }
  if ((gap_data.size._3_1_ & 1) == 0) {
    buffer = (uchar *)operator_new__((ulong)disk->side_[side].tracks[tr].size);
    memcpy(buffer,disk->side_[side].tracks[tr].bitfield + (uint)imge_item.track_byte,
           (ulong)(disk->side_[side].tracks[tr].size - imge_item.track_byte));
    memcpy(buffer + (disk->side_[side].tracks[tr].size - imge_item.track_byte),
           disk->side_[side].tracks[tr].bitfield,(ulong)(uint)imge_item.track_byte);
    local_f0 = 0;
    nb_backward_gap_bytes = 0;
    cVar32 = extraout_XMM0_Be;
    cVar33 = extraout_XMM0_Bf;
    cVar34 = extraout_XMM0_Bg;
    cVar35 = extraout_XMM0_Bh;
    cVar36 = extraout_XMM0_Bi;
    cVar37 = extraout_XMM0_Bj;
    cVar38 = extraout_XMM0_Bk;
    cVar39 = extraout_XMM0_Bl;
    cVar40 = extraout_XMM0_Bm;
    cVar41 = extraout_XMM0_Bn;
    cVar42 = extraout_XMM0_Bo;
    bVar43 = extraout_XMM0_Bp;
    uVar21 = disk->side_[side].tracks[tr].size;
    while( true ) {
      local_120 = uVar21 - 0x10;
      bVar29 = false;
      if ((uint)pattern_byte._12_4_ < local_120) {
        puVar24 = buffer + local_120;
        cVar30 = -(puVar24[2] == '\x01');
        cVar31 = -(puVar24[3] == '\0');
        cVar32 = -(puVar24[4] == '\x01');
        cVar33 = -(puVar24[5] == '\0');
        cVar34 = -(puVar24[6] == '\x01');
        cVar35 = -(puVar24[7] == '\0');
        cVar36 = -(puVar24[8] == '\x01');
        cVar37 = -(puVar24[9] == '\0');
        cVar38 = -(puVar24[10] == '\x01');
        cVar39 = -(puVar24[0xb] == '\0');
        cVar40 = -(puVar24[0xc] == '\x01');
        cVar41 = -(puVar24[0xd] == '\0');
        cVar42 = -(puVar24[0xe] == '\x01');
        bVar43 = -(puVar24[0xf] == '\0');
        auVar1[1] = -(puVar24[1] == '\0');
        auVar1[0] = -(*puVar24 == '\x01');
        auVar1[2] = cVar30;
        auVar1[3] = cVar31;
        auVar1[4] = cVar32;
        auVar1[5] = cVar33;
        auVar1[6] = cVar34;
        auVar1[7] = cVar35;
        auVar1[8] = cVar36;
        auVar1[9] = cVar37;
        auVar1[10] = cVar38;
        auVar1[0xb] = cVar39;
        auVar1[0xc] = cVar40;
        auVar1[0xd] = cVar41;
        auVar1[0xe] = cVar42;
        auVar1[0xf] = bVar43;
        auVar2[1] = -(puVar24[1] == '\0');
        auVar2[0] = -(*puVar24 == '\x01');
        auVar2[2] = cVar30;
        auVar2[3] = cVar31;
        auVar2[4] = cVar32;
        auVar2[5] = cVar33;
        auVar2[6] = cVar34;
        auVar2[7] = cVar35;
        auVar2[8] = cVar36;
        auVar2[9] = cVar37;
        auVar2[10] = cVar38;
        auVar2[0xb] = cVar39;
        auVar2[0xc] = cVar40;
        auVar2[0xd] = cVar41;
        auVar2[0xe] = cVar42;
        auVar2[0xf] = bVar43;
        auVar16[1] = cVar31;
        auVar16[0] = cVar30;
        auVar16[2] = cVar32;
        auVar16[3] = cVar33;
        auVar16[4] = cVar34;
        auVar16[5] = cVar35;
        auVar16[6] = cVar36;
        auVar16[7] = cVar37;
        auVar16[8] = cVar38;
        auVar16[9] = cVar39;
        auVar16[10] = cVar40;
        auVar16[0xb] = cVar41;
        auVar16[0xc] = cVar42;
        auVar16[0xd] = bVar43;
        auVar13[1] = cVar32;
        auVar13[0] = cVar31;
        auVar13[2] = cVar33;
        auVar13[3] = cVar34;
        auVar13[4] = cVar35;
        auVar13[5] = cVar36;
        auVar13[6] = cVar37;
        auVar13[7] = cVar38;
        auVar13[8] = cVar39;
        auVar13[9] = cVar40;
        auVar13[10] = cVar41;
        auVar13[0xb] = cVar42;
        auVar13[0xc] = bVar43;
        auVar10[1] = cVar33;
        auVar10[0] = cVar32;
        auVar10[2] = cVar34;
        auVar10[3] = cVar35;
        auVar10[4] = cVar36;
        auVar10[5] = cVar37;
        auVar10[6] = cVar38;
        auVar10[7] = cVar39;
        auVar10[8] = cVar40;
        auVar10[9] = cVar41;
        auVar10[10] = cVar42;
        auVar10[0xb] = bVar43;
        auVar7[1] = cVar34;
        auVar7[0] = cVar33;
        auVar7[2] = cVar35;
        auVar7[3] = cVar36;
        auVar7[4] = cVar37;
        auVar7[5] = cVar38;
        auVar7[6] = cVar39;
        auVar7[7] = cVar40;
        auVar7[8] = cVar41;
        auVar7[9] = cVar42;
        auVar7[10] = bVar43;
        bVar29 = false;
        if (((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar43,CONCAT18(cVar42,CONCAT17(cVar41,CONCAT16(
                                                  cVar40,CONCAT15(cVar39,CONCAT14(cVar38,CONCAT13(
                                                  cVar37,CONCAT12(cVar36,CONCAT11(cVar35,cVar34)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar43,CONCAT17(cVar42,CONCAT16(cVar41,CONCAT15(
                                                  cVar40,CONCAT14(cVar39,CONCAT13(cVar38,CONCAT12(
                                                  cVar37,CONCAT11(cVar36,cVar35)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar43 >> 7) << 0xf) == 0xffff) &&
           (bVar29 = true, local_120 != 0)) {
          bVar29 = buffer[uVar21 - 0x11] != '\x01';
        }
      }
      if (!bVar29) break;
      nb_backward_gap_bytes = nb_backward_gap_bytes + 1;
      uVar21 = local_120;
    }
    while (local_f0 != 0xffffffff) {
      block_descriptor.data_offset = 0;
      search_next_offset =
           CONCAT13(cVar35,CONCAT12(cVar34,CONCAT11(cVar33,cVar32))) ^
           CONCAT13(cVar35,CONCAT12(cVar34,CONCAT11(cVar33,cVar32)));
      block_descriptor.encoder_type =
           CONCAT13(cVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36))) ^
           CONCAT13(cVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36)));
      block_descriptor.gap_bits =
           CONCAT13(bVar43,CONCAT12(cVar42,CONCAT11(cVar41,cVar40))) ^
           CONCAT13(bVar43,CONCAT12(cVar42,CONCAT11(cVar41,cVar40)));
      block_descriptor.sps_specific.gap_offset = 0;
      end_of_block = 0;
      block_descriptor.sps_specific.cell_type = 0;
      block_descriptor.block_flag = data.buffer._4_4_;
      block_descriptor.block_bits = gap_data.buffer._4_4_;
      uVar21 = FindNextSector(buffer,disk->side_[side].tracks[tr].size,local_f0 + 1,8);
      if (uVar21 == 0xffffffff) {
        block_descriptor.data_offset = nb_backward_gap_bytes;
        nb_gap_bytes = disk->side_[side].tracks[tr].size + nb_backward_gap_bytes * -0x10;
      }
      else {
        block_descriptor.data_offset = 0;
        nb_gap_bytes = uVar21;
        while( true ) {
          offset_gap_1 = nb_gap_bytes - 0x10;
          bVar29 = false;
          if (local_f0 < offset_gap_1) {
            puVar24 = buffer + offset_gap_1;
            cVar32 = -(puVar24[2] == '\x01');
            cVar33 = -(puVar24[3] == '\0');
            cVar34 = -(puVar24[4] == '\x01');
            cVar35 = -(puVar24[5] == '\0');
            cVar36 = -(puVar24[6] == '\x01');
            cVar37 = -(puVar24[7] == '\0');
            cVar38 = -(puVar24[8] == '\x01');
            cVar39 = -(puVar24[9] == '\0');
            cVar40 = -(puVar24[10] == '\x01');
            cVar41 = -(puVar24[0xb] == '\0');
            cVar42 = -(puVar24[0xc] == '\x01');
            cVar30 = -(puVar24[0xd] == '\0');
            cVar31 = -(puVar24[0xe] == '\x01');
            bVar43 = -(puVar24[0xf] == '\0');
            auVar3[1] = -(puVar24[1] == '\0');
            auVar3[0] = -(*puVar24 == '\x01');
            auVar3[2] = cVar32;
            auVar3[3] = cVar33;
            auVar3[4] = cVar34;
            auVar3[5] = cVar35;
            auVar3[6] = cVar36;
            auVar3[7] = cVar37;
            auVar3[8] = cVar38;
            auVar3[9] = cVar39;
            auVar3[10] = cVar40;
            auVar3[0xb] = cVar41;
            auVar3[0xc] = cVar42;
            auVar3[0xd] = cVar30;
            auVar3[0xe] = cVar31;
            auVar3[0xf] = bVar43;
            auVar4[1] = -(puVar24[1] == '\0');
            auVar4[0] = -(*puVar24 == '\x01');
            auVar4[2] = cVar32;
            auVar4[3] = cVar33;
            auVar4[4] = cVar34;
            auVar4[5] = cVar35;
            auVar4[6] = cVar36;
            auVar4[7] = cVar37;
            auVar4[8] = cVar38;
            auVar4[9] = cVar39;
            auVar4[10] = cVar40;
            auVar4[0xb] = cVar41;
            auVar4[0xc] = cVar42;
            auVar4[0xd] = cVar30;
            auVar4[0xe] = cVar31;
            auVar4[0xf] = bVar43;
            auVar17[1] = cVar33;
            auVar17[0] = cVar32;
            auVar17[2] = cVar34;
            auVar17[3] = cVar35;
            auVar17[4] = cVar36;
            auVar17[5] = cVar37;
            auVar17[6] = cVar38;
            auVar17[7] = cVar39;
            auVar17[8] = cVar40;
            auVar17[9] = cVar41;
            auVar17[10] = cVar42;
            auVar17[0xb] = cVar30;
            auVar17[0xc] = cVar31;
            auVar17[0xd] = bVar43;
            auVar14[1] = cVar34;
            auVar14[0] = cVar33;
            auVar14[2] = cVar35;
            auVar14[3] = cVar36;
            auVar14[4] = cVar37;
            auVar14[5] = cVar38;
            auVar14[6] = cVar39;
            auVar14[7] = cVar40;
            auVar14[8] = cVar41;
            auVar14[9] = cVar42;
            auVar14[10] = cVar30;
            auVar14[0xb] = cVar31;
            auVar14[0xc] = bVar43;
            auVar11[1] = cVar35;
            auVar11[0] = cVar34;
            auVar11[2] = cVar36;
            auVar11[3] = cVar37;
            auVar11[4] = cVar38;
            auVar11[5] = cVar39;
            auVar11[6] = cVar40;
            auVar11[7] = cVar41;
            auVar11[8] = cVar42;
            auVar11[9] = cVar30;
            auVar11[10] = cVar31;
            auVar11[0xb] = bVar43;
            auVar8[1] = cVar36;
            auVar8[0] = cVar35;
            auVar8[2] = cVar37;
            auVar8[3] = cVar38;
            auVar8[4] = cVar39;
            auVar8[5] = cVar40;
            auVar8[6] = cVar41;
            auVar8[7] = cVar42;
            auVar8[8] = cVar30;
            auVar8[9] = cVar31;
            auVar8[10] = bVar43;
            bVar29 = false;
            if (((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(bVar43,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(
                                                  cVar42,CONCAT15(cVar41,CONCAT14(cVar40,CONCAT13(
                                                  cVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36)))))
                                                  )))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(bVar43,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(
                                                  cVar42,CONCAT14(cVar41,CONCAT13(cVar40,CONCAT12(
                                                  cVar39,CONCAT11(cVar38,cVar37)))))))) >> 7) & 1)
                          << 7 | (ushort)(bVar43 >> 7) << 0xf) == 0xffff) &&
               (bVar29 = true, offset_gap_1 != 0)) {
              bVar29 = buffer[nb_gap_bytes - 0x11] != '\x01';
            }
          }
          if (!bVar29) break;
          block_descriptor.data_offset = block_descriptor.data_offset + 1;
          nb_gap_bytes = offset_gap_1;
        }
      }
      puVar24 = buffer + (nb_gap_bytes + -0x10);
      uStack_108 = *puVar24;
      uStack_107 = puVar24[1];
      uStack_106 = puVar24[2];
      uStack_105 = puVar24[3];
      uStack_104 = puVar24[4];
      uStack_103 = puVar24[5];
      uStack_102 = puVar24[6];
      uStack_101 = puVar24[7];
      pattern_byte[0] = puVar24[8];
      pattern_byte[1] = puVar24[9];
      pattern_byte[2] = puVar24[10];
      pattern_byte[3] = puVar24[0xb];
      pattern_byte[4] = puVar24[0xc];
      pattern_byte[5] = puVar24[0xd];
      pattern_byte[6] = puVar24[0xe];
      pattern_byte[7] = puVar24[0xf];
      dbg_1 = 0;
      uStack_15c = nb_gap_bytes - 0x10;
      uVar22 = (*this->_vptr_CAPSFile[10])(this,&uStack_108,0x10);
      if ((uVar22 & 1) != 0) {
        while( true ) {
          bVar29 = false;
          if (local_f0 < uStack_15c) {
            puVar24 = buffer + uStack_15c;
            cVar32 = -(puVar24[2] == uStack_106);
            cVar33 = -(puVar24[3] == uStack_105);
            cVar34 = -(puVar24[4] == uStack_104);
            cVar35 = -(puVar24[5] == uStack_103);
            cVar36 = -(puVar24[6] == uStack_102);
            cVar37 = -(puVar24[7] == uStack_101);
            cVar38 = -(puVar24[8] == pattern_byte[0]);
            cVar39 = -(puVar24[9] == pattern_byte[1]);
            cVar40 = -(puVar24[10] == pattern_byte[2]);
            cVar41 = -(puVar24[0xb] == pattern_byte[3]);
            cVar42 = -(puVar24[0xc] == pattern_byte[4]);
            cVar30 = -(puVar24[0xd] == pattern_byte[5]);
            cVar31 = -(puVar24[0xe] == pattern_byte[6]);
            bVar43 = -(puVar24[0xf] == pattern_byte[7]);
            auVar5[1] = -(puVar24[1] == uStack_107);
            auVar5[0] = -(*puVar24 == uStack_108);
            auVar5[2] = cVar32;
            auVar5[3] = cVar33;
            auVar5[4] = cVar34;
            auVar5[5] = cVar35;
            auVar5[6] = cVar36;
            auVar5[7] = cVar37;
            auVar5[8] = cVar38;
            auVar5[9] = cVar39;
            auVar5[10] = cVar40;
            auVar5[0xb] = cVar41;
            auVar5[0xc] = cVar42;
            auVar5[0xd] = cVar30;
            auVar5[0xe] = cVar31;
            auVar5[0xf] = bVar43;
            auVar6[1] = -(puVar24[1] == uStack_107);
            auVar6[0] = -(*puVar24 == uStack_108);
            auVar6[2] = cVar32;
            auVar6[3] = cVar33;
            auVar6[4] = cVar34;
            auVar6[5] = cVar35;
            auVar6[6] = cVar36;
            auVar6[7] = cVar37;
            auVar6[8] = cVar38;
            auVar6[9] = cVar39;
            auVar6[10] = cVar40;
            auVar6[0xb] = cVar41;
            auVar6[0xc] = cVar42;
            auVar6[0xd] = cVar30;
            auVar6[0xe] = cVar31;
            auVar6[0xf] = bVar43;
            auVar18[1] = cVar33;
            auVar18[0] = cVar32;
            auVar18[2] = cVar34;
            auVar18[3] = cVar35;
            auVar18[4] = cVar36;
            auVar18[5] = cVar37;
            auVar18[6] = cVar38;
            auVar18[7] = cVar39;
            auVar18[8] = cVar40;
            auVar18[9] = cVar41;
            auVar18[10] = cVar42;
            auVar18[0xb] = cVar30;
            auVar18[0xc] = cVar31;
            auVar18[0xd] = bVar43;
            auVar15[1] = cVar34;
            auVar15[0] = cVar33;
            auVar15[2] = cVar35;
            auVar15[3] = cVar36;
            auVar15[4] = cVar37;
            auVar15[5] = cVar38;
            auVar15[6] = cVar39;
            auVar15[7] = cVar40;
            auVar15[8] = cVar41;
            auVar15[9] = cVar42;
            auVar15[10] = cVar30;
            auVar15[0xb] = cVar31;
            auVar15[0xc] = bVar43;
            auVar12[1] = cVar35;
            auVar12[0] = cVar34;
            auVar12[2] = cVar36;
            auVar12[3] = cVar37;
            auVar12[4] = cVar38;
            auVar12[5] = cVar39;
            auVar12[6] = cVar40;
            auVar12[7] = cVar41;
            auVar12[8] = cVar42;
            auVar12[9] = cVar30;
            auVar12[10] = cVar31;
            auVar12[0xb] = bVar43;
            auVar9[1] = cVar36;
            auVar9[0] = cVar35;
            auVar9[2] = cVar37;
            auVar9[3] = cVar38;
            auVar9[4] = cVar39;
            auVar9[5] = cVar40;
            auVar9[6] = cVar41;
            auVar9[7] = cVar42;
            auVar9[8] = cVar30;
            auVar9[9] = cVar31;
            auVar9[10] = bVar43;
            bVar29 = false;
            if ((((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                           (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                           (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                           (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                           (ushort)((byte)(CONCAT19(bVar43,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(
                                                  cVar42,CONCAT15(cVar41,CONCAT14(cVar40,CONCAT13(
                                                  cVar39,CONCAT12(cVar38,CONCAT11(cVar37,cVar36)))))
                                                  )))) >> 7) & 1) << 6 |
                           (ushort)((byte)(CONCAT18(bVar43,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(
                                                  cVar42,CONCAT14(cVar41,CONCAT13(cVar40,CONCAT12(
                                                  cVar39,CONCAT11(cVar38,cVar37)))))))) >> 7) & 1)
                           << 7 | (ushort)(bVar43 >> 7) << 0xf) == 0xffff) &&
                ((((buffer[uStack_15c] & buffer[uStack_15c - 1]) != 1 ||
                  (bVar29 = false, uStack_15c - 1 <= local_f0)) && (bVar29 = true, uStack_15c != 0))
                )) && ((bVar29 = false,
                       (buffer[uStack_15c - 1] & buffer[uStack_15c] & buffer[uStack_15c + 1]) == 1
                       && (bVar29 = true, 1 < uStack_15c)))) {
              bVar29 = (buffer[uStack_15c - 1] & buffer[uStack_15c] & buffer[uStack_15c - 2]) == 1;
            }
          }
          if (!bVar29) break;
          uStack_15c = uStack_15c - 0x10;
          dbg_1 = dbg_1 + 1;
        }
      }
      byte_00 = IDisk::ConvertMFMToByte(&uStack_108);
      AddGapRecord(this,(StreamRecording *)&data.size,dbg_1,byte_00);
      search_next_offset = dbg_1 * 0x10 + search_next_offset;
      if (0 < (int)block_descriptor.data_offset) {
        AddGapRecord(this,(StreamRecording *)&data.size,block_descriptor.data_offset,'\0');
        search_next_offset = block_descriptor.data_offset * 0x10 + search_next_offset;
        block_descriptor.sps_specific.cell_type = block_descriptor.sps_specific.cell_type | 2;
      }
      if (0 < dbg_1) {
        block_descriptor.sps_specific.cell_type = block_descriptor.sps_specific.cell_type | 1;
      }
      bVar29 = AddStreamRecord(this,(StreamRecording *)&max_size_data,buffer,local_f0,
                               uStack_15c + 0x10,disk->side_[side].tracks[tr].size);
      end_of_block = (uStack_15c + 0x10) - local_f0;
      block_descriptor.gap_bits = 1;
      block_descriptor.sps_specific.gap_offset = 1;
      if (!bVar29) {
        block_descriptor.sps_specific.cell_type = block_descriptor.sps_specific.cell_type | 4;
      }
      block_descriptor.encoder_type = 0x4e;
      std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::push_back
                ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_> *)
                 &track_field,(value_type *)&end_of_block);
      cVar32 = extraout_XMM0_Be_00;
      cVar33 = extraout_XMM0_Bf_00;
      cVar34 = extraout_XMM0_Bg_00;
      cVar35 = extraout_XMM0_Bh_00;
      cVar36 = extraout_XMM0_Bi_00;
      cVar37 = extraout_XMM0_Bj_00;
      cVar38 = extraout_XMM0_Bk_00;
      cVar39 = extraout_XMM0_Bl_00;
      cVar40 = extraout_XMM0_Bm_00;
      cVar41 = extraout_XMM0_Bn_00;
      cVar42 = extraout_XMM0_Bo_00;
      bVar43 = extraout_XMM0_Bp_00;
      local_f0 = uVar21;
    }
    if (buffer != (uchar *)0x0) {
      operator_delete__(buffer);
    }
  }
  gap_data.offset = 0x41544144;
  sVar25 = std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::size
                     ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
                       *)&track_field);
  iVar23 = (int)sVar25 * 0x20;
  it._M_current._4_4_ = iVar23 + gap_data.buffer._4_4_;
  data_chunk.header.length = iVar23 + gap_data.buffer._4_4_ + data.buffer._4_4_;
  data_chunk.header.crc = data_chunk.header.length * 8;
  data_chunk._20_8_ = operator_new__((ulong)data_chunk.header.length);
  it._M_current._0_4_ = 0;
  local_178._M_current =
       (anon_struct_32_7_d903e6a6 *)
       std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::begin
                 ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_> *)
                  &track_field);
  while( true ) {
    local_180._M_current =
         (anon_struct_32_7_d903e6a6 *)
         std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::end
                   ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_> *
                    )&track_field);
    bVar29 = __gnu_cxx::operator!=(&local_178,&local_180);
    if (!bVar29) break;
    paVar26 = __gnu_cxx::
              __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
              ::operator->(&local_178);
    iVar19 = it._M_current._4_4_;
    (paVar26->sps_specific).gap_offset = iVar23 + (paVar26->sps_specific).gap_offset;
    paVar26 = __gnu_cxx::
              __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
              ::operator->(&local_178);
    uVar20 = data_chunk._20_8_;
    paVar26->data_offset = iVar19 + paVar26->data_offset;
    lVar27 = (long)(int)it._M_current;
    paVar28 = __gnu_cxx::
              __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
              ::operator*(&local_178);
    *(undefined8 *)(uVar20 + lVar27) = *(undefined8 *)paVar28;
    *(EncoderSpsBlockDescriptor *)(uVar20 + 8 + lVar27) = paVar28->sps_specific;
    *(undefined8 *)(uVar20 + 0x10 + lVar27) = *(undefined8 *)&paVar28->encoder_type;
    *(undefined8 *)(uVar20 + 0x18 + lVar27) = *(undefined8 *)&paVar28->gap_value;
    Swap((uchar *)(data_chunk._20_8_ + (long)(int)it._M_current),0x20);
    it._M_current._0_4_ = (int)it._M_current + 0x20;
    __gnu_cxx::
    __normal_iterator<CAPSFile::BlockDescriptor_*,_std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>_>
    ::operator++(&local_178,0);
  }
  memcpy((void *)(data_chunk._20_8_ + (long)iVar23),(void *)data._8_8_,(ulong)gap_data.buffer._4_4_)
  ;
  memcpy((void *)(data_chunk._20_8_ + (long)it._M_current._4_4_),_max_size_data,
         (ulong)data.buffer._4_4_);
  data_chunk.bit_size = datakey;
  data_chunk.size =
       CRC::ComputeCrc32(0xedb88320,(uchar *)data_chunk._20_8_,data_chunk.header.length);
  uVar21 = CRC::ComputeCrc32(0xedb88320,(uchar *)&data_chunk.buffer,0x50);
  SwapInt(uVar21);
  std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::push_back
            (&this->list_imge_,(value_type *)&data_chunk.buffer);
  std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>::push_back
            (&this->list_data_,(value_type *)&gap_data.offset);
  if (_max_size_data != (uchar *)0x0) {
    operator_delete__(_max_size_data);
  }
  if (data._8_8_ != 0) {
    operator_delete__((void *)data._8_8_);
  }
  std::vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>::~vector
            ((vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_> *)
             &track_field);
  return 0;
}

Assistant:

int CAPSFile::CreateData(IDisk* disk, int side, unsigned int tr, int datakey)
{
   // Create IMGE and data structure
   ImgeItem imge_item;
   DataChunks data_chunk;

   bool abort = false;

   StreamRecording gap_data;
   StreamRecording data;
   data.offset = 0;
   data.buffer = new unsigned char[128];
   data.size = 128;

   gap_data.offset = 0;
   gap_data.buffer = new unsigned char[128];
   gap_data.size = 128;

   int gap_offset = 0;
   //unsigned char* pData = new unsigned char[128];
   int max_size_data = 128;

   // Block descriptor vector
   std::vector<BlockDescriptor> list_block_descriptor;


   memset(&imge_item, 0, sizeof(imge_item));
   memset(&data_chunk, 0, sizeof(data_chunk));

   // &disk->m_Disk[side].Tracks[tr]);

   ////////////
   // IMGE
   memcpy(imge_item.header.type, "IMGE", 4);
   imge_item.header.crc = 0;
   imge_item.header.length = 0x50;
   imge_item.track_number = tr;
   imge_item.side = side;
   imge_item.density = 2; // auto
   imge_item.signal_type = 1; // 2us cell
   imge_item.track_byte = 0; //
   imge_item.start_byte_pos = 0;
   imge_item.start_bit_pos = 0;
   imge_item.data_bits = 0;
   imge_item.gap_bits = 0;
   imge_item.track_bits = 0;
   imge_item.block_count = 0;
   imge_item.encoder_process = 0; // 0
   imge_item.track_flags = 0;
   imge_item.data_key = 0;

   // Nothing on this side / track ?
   if (side >= disk->nb_sides_ || tr >= disk->side_[side].nb_tracks)
   {
      imge_item.start_bit_pos = 0;
      imge_item.density = 1;
      abort = true;
      //goto End;//return 0;
   }

   unsigned char* track_field = nullptr;
   if (!abort)
   {
      track_field = disk->side_[side].tracks[tr].bitfield;
      // DATA
      if (track_field == NULL)
      {
         imge_item.start_bit_pos = 0;
         imge_item.density = 1;
         abort = true;
         //goto End;//return 0;
      }
   }

   unsigned int startbitpos = 0;
   // Construct DATA associated :
   // Find begining of track

   // Find the 0x5224 0x5224 0x5224  first sync
   unsigned int search_offset = 0;
   unsigned int current_recored_offset = 0;

   unsigned char pattern_byte[16];

   if (!abort)
   {
      // Only search the 3 x 0x5224 bytes
      search_offset = FindNextPattern(track_field, disk->side_[side].tracks[tr].size, search_offset, pPatternC2, 6);
      if (search_offset != -1)
      {
         imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
         imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
      }
      else
      {
         search_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size, search_offset + 1, 8);
         if (search_offset != -1)
         {
            imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
            imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
         }
         else
         {
            // Not a formatted disk : Generate random data
            imge_item.start_bit_pos = 0;
            imge_item.density = 1;
            int dbg = 1;
            //goto End;
            abort = true;
         }
      }
   }

   if (!abort)
   {
      track_field = new unsigned char[disk->side_[side].tracks[tr].size];
      memcpy(track_field, &disk->side_[side].tracks[tr].bitfield[imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].size - imge_item.start_bit_pos);
      memcpy(&track_field[disk->side_[side].tracks[tr].size - imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].bitfield, imge_item.start_bit_pos);

      search_offset = 0;
      int initial_backward_gap = 0;
      unsigned int offset_gap = disk->side_[side].tracks[tr].size - 16;
      while ((offset_gap > current_recored_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
         && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
      )
      {
         offset_gap -= 16;
         initial_backward_gap++;
      }

      while (search_offset != -1)
      {
         int nb_backward_gap_bytes = 0;
         // Add it : Descriptor, and data
         BlockDescriptor block_descriptor;
         memset(&block_descriptor, 0, sizeof(block_descriptor));

         block_descriptor.block_flag = 0;
         block_descriptor.data_offset = data.offset;
         block_descriptor.sps_specific.gap_offset = gap_data.offset;


         unsigned int search_next_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size,
                                                          search_offset + 1, 8);
         int end_of_block = 0;
         if (search_next_offset != -1)
         {
            // Next block found : Dont use the '0x00' sync bytes before it - It's the 'backward' gap
            unsigned int offset_gap = search_next_offset - 16;
            nb_backward_gap_bytes = 0;
            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
               && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
            )
            {
               offset_gap -= 16;
               nb_backward_gap_bytes++;
            }
            end_of_block = offset_gap + 16;
         }
         else
         {
            // End block : until the end, then until IMGEitem.start_bit_pos
            nb_backward_gap_bytes = initial_backward_gap;
            end_of_block = disk->side_[side].tracks[tr].size - nb_backward_gap_bytes * 16;
         }

         // What to record : From the next block, until it changed, record the "forward gap"
         memcpy(pattern_byte, &track_field[end_of_block - 16], 16);
         int nb_gap_bytes = 0;
         unsigned int offset_gap = end_of_block - 16;

         // Only if no weak bits in the pattern !
         if (NoWeakBitInPattern(pattern_byte, 16))
         {
            if (pattern_byte[0] == 0
               && pattern_byte[15] == 0
               && (pattern_byte[14] & pattern_byte[1]) == 0
            )
            {
               int dbg = 1;
            }

            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pattern_byte, 16) == 0)
               && (((track_field[offset_gap] & track_field[offset_gap - 1]) != 1) || offset_gap - 1 <= search_offset)
               && (offset_gap < 1 || ((track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap +
                     1]) == 1)
                  && (offset_gap < 2 || (track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap
                     - 2]) == 1)
               )
            )
            {
               offset_gap -= 16;
               nb_gap_bytes++;
            }
         }
         offset_gap += 16;
         // pPatternByte -> signel byte
         unsigned char byte = IDisk::ConvertMFMToByte(pattern_byte);
         {
            AddGapRecord(&gap_data, nb_gap_bytes, byte);
            block_descriptor.gap_bits += nb_gap_bytes * 16;
            if (nb_backward_gap_bytes > 0)
            {
               AddGapRecord(&gap_data, nb_backward_gap_bytes, 0x00);
               block_descriptor.gap_bits += nb_backward_gap_bytes * 16;
               imge_item.gap_bits += 16 * nb_backward_gap_bytes;
               imge_item.track_byte += nb_backward_gap_bytes * 2;
               block_descriptor.block_flag |= 2;
            }


            imge_item.gap_bits += 16 * nb_gap_bytes;
            imge_item.track_byte += nb_gap_bytes * 2;
            if (nb_gap_bytes > 0)
               block_descriptor.block_flag |= 1;

            // TODO : Adjust at bit value
            // data itself : Add the data (supposed to pPatternC2 + 16 bits (FC most of the time)
            // From searchOffset -> offsetGap;
            bool byte_size = AddStreamRecord(&data, track_field, search_offset, offset_gap,
                                             disk->side_[side].tracks[tr].size);
            imge_item.data_bits += (offset_gap - search_offset);
            imge_item.track_byte += (offset_gap - search_offset + 7) / 8;

            // Block descriptor : End the description
            block_descriptor.block_bits = (offset_gap - search_offset);
            block_descriptor.sps_specific.cell_type = 1;
            block_descriptor.encoder_type = 1;

            if (!byte_size)
               block_descriptor.block_flag |= 4; // in byte. TODO : Use value for bits
            block_descriptor.gap_value = 0x4E;

            list_block_descriptor.push_back(block_descriptor);
            imge_item.block_count++;

            search_offset = search_next_offset;
         }

         // Next blocks
      }

      delete[]track_field;
   }
   // End of track (or unformatted ones !)
   // TODO
   //End:

   // End : Now compile every descriptor, then every datas ( ).
   // dataoffset and gapoffsets
   memcpy(data_chunk.header.type, "DATA", 4);
   data_chunk.header.length = sizeof (data_chunk) - sizeof (unsigned char*); //+ listBlockDescriptor.size() * sizeof(tBlockDescriptor);
   //dataChunk.header.Length += data.Offset + gapData.Offset;
   data_chunk.size = list_block_descriptor.size() * sizeof(BlockDescriptor);
   int final_gap_offset = data_chunk.size;
   int final_data_offset = final_gap_offset + gap_data.offset;

   data_chunk.size += gap_data.offset;
   data_chunk.size += data.offset;
   data_chunk.bit_size = data_chunk.size * 8;

   // Now compile DATA chunks into a buffer
   data_chunk.buffer = new unsigned char[data_chunk.size];
   int final_offset = 0;

   for (std::vector<BlockDescriptor>::iterator it = list_block_descriptor.begin(); it != list_block_descriptor.end(); it
        ++)
   {
      // Adjust gap offset
      it->sps_specific.gap_offset += final_gap_offset;
      // Adjust data offset
      it->data_offset += final_data_offset;

      // Copy block descriptor
      memcpy(&data_chunk.buffer[final_offset], &(*it), sizeof(BlockDescriptor));
      Swap(&data_chunk.buffer[final_offset], sizeof(BlockDescriptor));
      final_offset += sizeof(BlockDescriptor);
   }
   memcpy(&data_chunk.buffer[final_gap_offset], gap_data.buffer, gap_data.offset);
   memcpy(&data_chunk.buffer[final_data_offset], data.buffer, data.offset);

   data_chunk.data_id = imge_item.data_key = datakey;
   data_chunk.data_crc = CRC::ComputeCrc32(0xEDB88320, data_chunk.buffer, data_chunk.size);

   // Now, update IMGE
   imge_item.track_bits = imge_item.gap_bits + imge_item.data_bits;

   if (side < disk->nb_sides_ && tr < disk->side_[side].nb_tracks)
   {
      if (disk->side_[side].tracks[tr].size != imge_item.track_bits)
      {
         // error ?
         int dbg = 1;
      }
   }
   // .. To add

   // CRC
   imge_item.header.crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, (unsigned char*)&imge_item, sizeof(imge_item)));

   list_imge_.push_back(imge_item);
   list_data_.push_back(data_chunk);

   delete []data.buffer;
   delete []gap_data.buffer;

   return 0;
}